

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall asl::Array<char>::dup(Array<char> *this,int __fd)

{
  int *piVar1;
  char *in_RAX;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  Array<char> local_18;
  
  if (*(int *)(this->_a + -8) != 1) {
    local_18._a = in_RAX;
    clone(&local_18,(__fn *)this,in_RDX,in_ECX,in_R8);
    if (this->_a != local_18._a) {
      LOCK();
      piVar1 = (int *)(this->_a + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(this->_a + -0x10);
      }
      this->_a = (char *)local_18;
      LOCK();
      *(int *)(local_18._a + -8) = *(int *)(local_18._a + -8) + 1;
      UNLOCK();
    }
    LOCK();
    piVar1 = (int *)(local_18._a + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free(local_18._a + -0x10);
    }
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}